

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O0

var cs::try_move(var *val)

{
  any *in_RSI;
  proxy *in_RDI;
  any *in_stack_ffffffffffffffd8;
  proxy *this;
  
  this = in_RDI;
  cs_impl::any::try_move(in_RSI);
  cs_impl::any::any((any *)this,in_stack_ffffffffffffffd8);
  return (var)in_RDI;
}

Assistant:

var try_move(const var &val)
	{
		val.try_move();
		return val;
	}